

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQObjectValue x;
  long lVar3;
  SQLocalVarInfo *this;
  long lVar4;
  SQObjectPtr o;
  SQObjectPtr name_1;
  SQUnsignedInteger local_d8;
  SQObjectPtr name;
  SQObjectPtr sourcename;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQLocalVarInfo lvi;
  SQUnsignedInteger type;
  SQObjectPtr proto;
  
  sourcename.super_SQObject._type = OT_NULL;
  sourcename.super_SQObject._unVal.pTable = (SQTable *)0x0;
  name.super_SQObject._type = OT_NULL;
  name.super_SQObject._unVal.pTable = (SQTable *)0x0;
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar2 = CheckTag(v,read,up,0x50415254);
  if (bVar2) {
    bVar2 = ReadObject(v,up,read,&sourcename);
    if (bVar2) {
      bVar2 = ReadObject(v,up,read,&name);
      if (bVar2) {
        bVar2 = CheckTag(v,read,up,0x50415254);
        if (bVar2) {
          bVar2 = SafeRead(v,read,up,&nliterals,8);
          if (bVar2) {
            bVar2 = SafeRead(v,read,up,&nparameters,8);
            if (bVar2) {
              bVar2 = SafeRead(v,read,up,&noutervalues,8);
              if (bVar2) {
                bVar2 = SafeRead(v,read,up,&nlocalvarinfos,8);
                if (bVar2) {
                  bVar2 = SafeRead(v,read,up,&nlineinfos,8);
                  if (bVar2) {
                    bVar2 = SafeRead(v,read,up,&ndefaultparams,8);
                    if (bVar2) {
                      bVar2 = SafeRead(v,read,up,&ninstructions,8);
                      if (bVar2) {
                        bVar2 = SafeRead(v,read,up,&nfunctions,8);
                        if (bVar2) {
                          x.pFunctionProto =
                               Create(v->_sharedstate,ninstructions,nliterals,nparameters,nfunctions
                                      ,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
                          proto.super_SQObject._type = OT_FUNCPROTO;
                          pSVar1 = &((x.pTable)->super_SQDelegable).super_SQCollectable.
                                    super_SQRefCounted._uiRef;
                          *pSVar1 = *pSVar1 + 1;
                          proto.super_SQObject._unVal.pFunctionProto = x.pFunctionProto;
                          SQObjectPtr::operator=(&(x.pGenerator)->_closure,&sourcename);
                          SQObjectPtr::operator=(&(x.pOuter)->_value,&name);
                          bVar2 = CheckTag(v,read,up,0x50415254);
                          if (bVar2) {
                            lVar4 = 0;
                            for (lVar3 = 0; lVar3 < nliterals; lVar3 = lVar3 + 1) {
                              bVar2 = ReadObject(v,up,read,&o);
                              if (!bVar2) goto LAB_00120c67;
                              SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         ((long)&((*(SQObjectPtr **)&((x.pGenerator)->_ci)._ncalls)
                                                 ->super_SQObject)._type + lVar4),&o);
                              lVar4 = lVar4 + 0x10;
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            lVar4 = 0;
                            for (lVar3 = 0; lVar3 < nparameters; lVar3 = lVar3 + 1) {
                              bVar2 = ReadObject(v,up,read,&o);
                              if (!bVar2) goto LAB_00120c67;
                              SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         ((long)&((SQObject *)
                                                 &(((x.pGenerator)->_etraps)._vals)->_stackbase)->
                                                 _type + lVar4),&o);
                              lVar4 = lVar4 + 0x10;
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            lVar4 = 0;
                            for (lVar3 = 0; lVar3 < noutervalues; lVar3 = lVar3 + 1) {
                              name_1.super_SQObject._type = OT_NULL;
                              name_1.super_SQObject._unVal.pTable = (SQTable *)0x0;
                              bVar2 = SafeRead(v,read,up,&type,8);
                              if (!bVar2) {
LAB_00120c5d:
                                this = (SQLocalVarInfo *)&name_1;
                                goto LAB_00120c62;
                              }
                              bVar2 = ReadObject(v,up,read,&o);
                              if (!bVar2) goto LAB_00120c5d;
                              bVar2 = ReadObject(v,up,read,&name_1);
                              if (!bVar2) goto LAB_00120c5d;
                              SQOuterVar::SQOuterVar
                                        ((SQOuterVar *)&lvi,&name_1,&o,(SQOuterType)type);
                              SQOuterVar::operator=
                                        ((SQOuterVar *)
                                         ((long)&(x.pFunctionProto)->_outervalues->_type + lVar4),
                                         (SQOuterVar *)&lvi);
                              SQOuterVar::~SQOuterVar((SQOuterVar *)&lvi);
                              SQObjectPtr::~SQObjectPtr(&name_1);
                              lVar4 = lVar4 + 0x28;
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            local_d8 = 0;
                            for (lVar3 = 0; lVar3 < nlocalvarinfos; lVar3 = lVar3 + 1) {
                              lvi._name.super_SQObject._type = OT_NULL;
                              lvi._end_op = 0;
                              lvi._pos = 0;
                              lvi._name.super_SQObject._unVal.pTable = (SQTable *)0x0;
                              lvi._start_op = 0;
                              bVar2 = ReadObject(v,up,read,&lvi._name);
                              if (!bVar2) {
LAB_00120d76:
                                this = &lvi;
LAB_00120c62:
                                SQObjectPtr::~SQObjectPtr(&this->_name);
                                goto LAB_00120c67;
                              }
                              bVar2 = SafeRead(v,read,up,&lvi._pos,8);
                              if (!bVar2) goto LAB_00120d76;
                              bVar2 = SafeRead(v,read,up,&lvi._start_op,8);
                              if (!bVar2) goto LAB_00120d76;
                              bVar2 = SafeRead(v,read,up,&lvi._end_op,8);
                              if (!bVar2) goto LAB_00120d76;
                              SQLocalVarInfo::operator=
                                        ((SQLocalVarInfo *)
                                         ((long)&((((x.pGenerator)->_ci)._closure.super_SQObject.
                                                   _unVal.pTable)->super_SQDelegable).
                                                 super_SQCollectable.super_SQRefCounted.
                                                 _vptr_SQRefCounted + local_d8),&lvi);
                              SQObjectPtr::~SQObjectPtr(&lvi._name);
                              local_d8 = local_d8 + 0x28;
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = SafeRead(v,read,up,
                                             *(SQLineInfo **)&((x.pGenerator)->_ci)._etraps,
                                             nlineinfos << 4);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = SafeRead(v,read,up,(x.pFunctionProto)->_defaultparams,
                                             ndefaultparams << 3);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = SafeRead(v,read,up,(x.pFunctionProto)->_instructions,
                                             ninstructions << 3);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00120c67;
                            lVar4 = 0;
                            for (lVar3 = 0; lVar3 < nfunctions; lVar3 = lVar3 + 1) {
                              bVar2 = Load(v,up,read,&o);
                              if (!bVar2) goto LAB_00120c67;
                              SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         ((long)&(((SQObjectPtr *)
                                                  ((x.pGenerator)->_etraps)._allocated)->
                                                 super_SQObject)._type + lVar4),&o);
                              lVar4 = lVar4 + 0x10;
                            }
                            bVar2 = SafeRead(v,read,up,&(x.pTable)->_usednodes,8);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = SafeRead(v,read,up,&(x.pClosure)->_defaultparams,1);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = SafeRead(v,read,up,&((x.pGenerator)->_ci)._literals,8);
                            if (!bVar2) goto LAB_00120c67;
                            bVar2 = true;
                            SQObjectPtr::operator=(ret,x.pFunctionProto);
                          }
                          else {
LAB_00120c67:
                            bVar2 = false;
                          }
                          SQObjectPtr::~SQObjectPtr(&proto);
                          goto LAB_00120adb;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_00120adb:
  SQObjectPtr::~SQObjectPtr(&o);
  SQObjectPtr::~SQObjectPtr(&name);
  SQObjectPtr::~SQObjectPtr(&sourcename);
  return bVar2;
}

Assistant:

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    SQInteger i, nliterals,nparameters;
    SQInteger noutervalues ,nlocalvarinfos ;
    SQInteger nlineinfos,ninstructions ,nfunctions,ndefaultparams ;
    SQObjectPtr sourcename, name;
    SQObjectPtr o;
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(ReadObject(v, up, read, sourcename));
    _CHECK_IO(ReadObject(v, up, read, name));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, &nliterals, sizeof(nliterals)));
    _CHECK_IO(SafeRead(v,read,up, &nparameters, sizeof(nparameters)));
    _CHECK_IO(SafeRead(v,read,up, &noutervalues, sizeof(noutervalues)));
    _CHECK_IO(SafeRead(v,read,up, &nlocalvarinfos, sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeRead(v,read,up, &nlineinfos, sizeof(nlineinfos)));
    _CHECK_IO(SafeRead(v,read,up, &ndefaultparams, sizeof(ndefaultparams)));
    _CHECK_IO(SafeRead(v,read,up, &ninstructions, sizeof(ninstructions)));
    _CHECK_IO(SafeRead(v,read,up, &nfunctions, sizeof(nfunctions)));


    SQFunctionProto *f = SQFunctionProto::Create(_opt_ss(v),ninstructions,nliterals,nparameters,
            nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
    SQObjectPtr proto = f; //gets a ref in case of failure
    f->_sourcename = sourcename;
    f->_name = name;

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0;i < nliterals; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_literals[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nparameters; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_parameters[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < noutervalues; i++){
        SQUnsignedInteger type;
        SQObjectPtr name;
        _CHECK_IO(SafeRead(v,read,up, &type, sizeof(SQUnsignedInteger)));
        _CHECK_IO(ReadObject(v, up, read, o));
        _CHECK_IO(ReadObject(v, up, read, name));
        f->_outervalues[i] = SQOuterVar(name,o, (SQOuterType)type);
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nlocalvarinfos; i++){
        SQLocalVarInfo lvi;
        _CHECK_IO(ReadObject(v, up, read, lvi._name));
        _CHECK_IO(SafeRead(v,read,up, &lvi._pos, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._start_op, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._end_op, sizeof(SQUnsignedInteger)));
        f->_localvarinfos[i] = lvi;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_lineinfos, sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_defaultparams, sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_instructions, sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    for(i = 0; i < nfunctions; i++){
        _CHECK_IO(_funcproto(o)->Load(v, up, read, o));
        f->_functions[i] = o;
    }
    _CHECK_IO(SafeRead(v,read,up, &f->_stacksize, sizeof(f->_stacksize)));
    _CHECK_IO(SafeRead(v,read,up, &f->_bgenerator, sizeof(f->_bgenerator)));
    _CHECK_IO(SafeRead(v,read,up, &f->_varparams, sizeof(f->_varparams)));

    ret = f;
    return true;
}